

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O2

void slab_cache_create(slab_cache *cache,slab_arena *arena)

{
  ulong uVar1;
  uint uVar2;
  rlist *prVar3;
  pthread_t pVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  unsigned_long _zzq_args [6];
  unsigned_long _zzq_result;
  
  cache->arena = arena;
  uVar2 = arena->slab_size;
  if (0x3fff < uVar2) {
    uVar1 = 0x3f;
    if (uVar2 >> 0xe != 0) {
      for (; (uVar2 >> 0xe) >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar5 = 0xf;
    if (uVar1 < 0xf) {
      uVar5 = uVar1;
    }
    uVar2 = uVar2 >> ((byte)uVar5 & 0x1f);
    cache->order_max = (byte)uVar5;
    cache->order0_size = uVar2;
    lVar6 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    cache->order0_size_lb = (uint8_t)lVar6;
    (cache->allocated).slabs.next = &(cache->allocated).slabs;
    (cache->allocated).slabs.prev = &(cache->allocated).slabs;
    (cache->allocated).stats.used = 0;
    (cache->allocated).stats.total = 0;
    prVar3 = &cache->orders[0].slabs;
    lVar6 = uVar5 + 1;
    while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
      prVar3->next = prVar3;
      prVar3->prev = prVar3;
      prVar3[1].prev = (rlist *)0x0;
      prVar3[1].next = (rlist *)0x0;
      prVar3 = prVar3 + 2;
    }
    pVar4 = pthread_self();
    cache->thread_id = pVar4;
    return;
  }
  __assert_fail("(long)arena->slab_size >= min_order0_size",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_cache.c"
                ,0xb2,"void slab_cache_create(struct slab_cache *, struct slab_arena *)");
}

Assistant:

void
slab_cache_create(struct slab_cache *cache, struct slab_arena *arena)
{
	cache->arena = arena;
	/*
	 * We have a fixed number of orders (ORDER_MAX); calculate
	 * the size of buddies in the smallest order, given the size
	 * of the slab size in the slab arena.
	 */
	long min_order0_size = SLAB_MIN_ORDER0_SIZE;
	assert((long)arena->slab_size >= min_order0_size);
	cache->order_max = small_lb(arena->slab_size / min_order0_size);
	if (cache->order_max > ORDER_MAX - 1)
		cache->order_max = ORDER_MAX - 1;

	cache->order0_size = arena->slab_size >> cache->order_max;
	cache->order0_size_lb = small_lb(cache->order0_size);

	slab_list_create(&cache->allocated);
	uint8_t i;
	for (i = 0; i <= cache->order_max; i++)
		slab_list_create(&cache->orders[i]);
	slab_cache_set_thread(cache);

	VALGRIND_CREATE_MEMPOOL_EXT(cache, 0, 0, VALGRIND_MEMPOOL_METAPOOL |
				    VALGRIND_MEMPOOL_AUTO_FREE);
}